

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gencode.c
# Opt level: O0

block * gen_acode(compiler_state_t *cstate,u_char *eaddr,qual q)

{
  block *pbVar1;
  u_char *eaddr_local;
  compiler_state_t *cstate_local;
  qual q_local;
  
  if ((cstate->linktype == 7) || (cstate->linktype == 0x81)) {
    cstate_local._4_1_ = q.addr;
    if (((cstate_local._4_1_ == '\x01') || (cstate_local._4_1_ == '\0')) &&
       (cstate_local._5_1_ = q.proto, cstate_local._5_1_ == '\x01')) {
      pbVar1 = gen_ahostop(cstate,eaddr,(uint)q >> 0x10 & 0xff);
      return pbVar1;
    }
    bpf_error(cstate,"ARCnet address used in non-arc expression");
  }
  else {
    bpf_error(cstate,"aid supported only on ARCnet");
  }
  bpf_error(cstate,"ARCnet address used in non-arc expression");
  return (block *)0x0;
}

Assistant:

struct block *
gen_acode(compiler_state_t *cstate, const u_char *eaddr, struct qual q)
{
	switch (cstate->linktype) {

	case DLT_ARCNET:
	case DLT_ARCNET_LINUX:
		if ((q.addr == Q_HOST || q.addr == Q_DEFAULT) &&
		    q.proto == Q_LINK)
			return (gen_ahostop(cstate, eaddr, (int)q.dir));
		else {
			bpf_error(cstate, "ARCnet address used in non-arc expression");
			/* NOTREACHED */
		}
		break;

	default:
		bpf_error(cstate, "aid supported only on ARCnet");
		/* NOTREACHED */
	}
	bpf_error(cstate, "ARCnet address used in non-arc expression");
	/* NOTREACHED */
	return NULL;
}